

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

void bcf_hdr_destroy(bcf_hdr_t *h)

{
  kh_vdict_t *h_00;
  byte bVar1;
  ulong uVar2;
  long lVar3;
  
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    h_00 = (kh_vdict_t *)h->dict[lVar3];
    if (h_00 != (kh_vdict_t *)0x0) {
      bVar1 = 0;
      for (uVar2 = 0; (khint_t)uVar2 != h_00->n_buckets; uVar2 = (ulong)((khint_t)uVar2 + 1)) {
        if ((h_00->flags[uVar2 >> 4] >> (bVar1 & 0x1e) & 3) == 0) {
          free(h_00->keys[uVar2]);
        }
        bVar1 = bVar1 + 2;
      }
      kh_destroy_vdict(h_00);
      free(h->id[lVar3]);
    }
  }
  for (lVar3 = 0; lVar3 < h->nhrec; lVar3 = lVar3 + 1) {
    bcf_hrec_destroy(h->hrec[lVar3]);
  }
  if (h->nhrec != 0) {
    free(h->hrec);
  }
  free(h->samples);
  free(h->keep_samples);
  free(h->transl[0]);
  free(h->transl[1]);
  free((h->mem).s);
  free(h);
  return;
}

Assistant:

void bcf_hdr_destroy(bcf_hdr_t *h)
{
    int i;
    khint_t k;
    for (i = 0; i < 3; ++i) {
        vdict_t *d = (vdict_t*)h->dict[i];
        if (d == 0) continue;
        for (k = kh_begin(d); k != kh_end(d); ++k)
            if (kh_exist(d, k)) free((char*)kh_key(d, k));
        kh_destroy(vdict, d);
        free(h->id[i]);
    }
    for (i=0; i<h->nhrec; i++)
        bcf_hrec_destroy(h->hrec[i]);
    if (h->nhrec) free(h->hrec);
    if (h->samples) free(h->samples);
    free(h->keep_samples);
    free(h->transl[0]); free(h->transl[1]);
    free(h->mem.s);
    free(h);
}